

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O3

void av1_nn_propagate_4to4_sse3(float *inputs,float *weights,__m128 *outputs,int num_inputs)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  bool bVar14;
  float *pfVar15;
  ulong uVar16;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  fVar3 = *inputs;
  fVar4 = inputs[1];
  fVar5 = inputs[2];
  fVar6 = inputs[3];
  uVar16 = 0;
  pfVar15 = &local_18;
  bVar13 = true;
  do {
    bVar14 = bVar13;
    pfVar1 = weights + uVar16 * (long)num_inputs;
    fVar7 = pfVar1[2];
    fVar8 = pfVar1[3];
    pfVar2 = weights + (uVar16 | 1) * (long)num_inputs;
    fVar9 = *pfVar2;
    fVar10 = pfVar2[1];
    fVar11 = pfVar2[2];
    fVar12 = pfVar2[3];
    *pfVar15 = *pfVar1 * fVar3 + pfVar1[1] * fVar4;
    pfVar15[1] = fVar7 * fVar5 + fVar8 * fVar6;
    pfVar15[2] = fVar9 * fVar3 + fVar10 * fVar4;
    pfVar15[3] = fVar11 * fVar5 + fVar12 * fVar6;
    uVar16 = 2;
    pfVar15 = &local_28;
    bVar13 = false;
  } while (bVar14);
  fVar3 = (*outputs)[1];
  fVar4 = (*outputs)[2];
  fVar5 = (*outputs)[3];
  (*outputs)[0] = local_18 + fStack_14 + (*outputs)[0];
  (*outputs)[1] = fStack_10 + fStack_c + fVar3;
  (*outputs)[2] = local_28 + fStack_24 + fVar4;
  (*outputs)[3] = fStack_20 + fStack_1c + fVar5;
  return;
}

Assistant:

void av1_nn_propagate_4to4_sse3(const float *const inputs,
                                const float *const weights,
                                __m128 *const outputs, const int num_inputs) {
  const __m128 inputs128 = _mm_loadu_ps(inputs);

  __m128 hadd[2];
  for (int i = 0; i < 2; i++) {  // For each pair of outputs
    const __m128 weight0 = _mm_loadu_ps(&weights[2 * i * num_inputs]);
    const __m128 mul0 = _mm_mul_ps(weight0, inputs128);
    const __m128 weight1 = _mm_loadu_ps(&weights[(2 * i + 1) * num_inputs]);
    const __m128 mul1 = _mm_mul_ps(weight1, inputs128);
    hadd[i] = _mm_hadd_ps(mul0, mul1);
  }
  // hadd[0] = [7+6 5+4 3+2 1+0] (weight indices)
  // hadd[1] = [15+14 13+12 11+10 9+8]

  const __m128 hh = _mm_hadd_ps(hadd[0], hadd[1]);
  // [15+14+13+12 11+10+9+8 7+6+5+4 3+2+1+0]

  *outputs = _mm_add_ps(*outputs, hh);
}